

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CulturalFeatureAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::CulturalFeatureAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CulturalFeatureAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Cultural Feature Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\tDamage:                 ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tSmoke Emanating:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tFlaming Effect:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tFrozen Status:          ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tInternal Heat:          ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tState:                  ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tExterior Lights:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tInterior Lights:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tMasked/Cloaked:         ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString CulturalFeatureAppearance::GetAsString() const
{
  KStringStream ss;

  ss << "Cultural Feature Appearance:"
     << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
     << "\n\tSmoke Emanating:        " << m_Smoke
     << "\n\tFlaming Effect:         " << m_FlamingEffectField
     << "\n\tFrozen Status:          " << m_FrozenStatus
     << "\n\tInternal Heat:          " << m_InternalHeatStatus
     << "\n\tState:                  " << m_State
     << "\n\tExterior Lights:        " << m_InteriorLights
     << "\n\tInterior Lights:        " << m_InteriorLights
     << "\n\tMasked/Cloaked:         " << m_MaskedCloaked
     << "\n";

  return ss.str();
}